

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setLevelSetVisibleQuantity
          (VolumeMeshVertexScalarQuantity *this,string *name)

{
  VolumeMesh *this_00;
  ShaderProgram *program;
  Engine *pEVar1;
  Engine *this_01;
  iterator iVar2;
  VolumeMeshVertexScalarQuantity *this_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_103;
  allocator local_102;
  allocator local_101;
  string local_100;
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>_>
                  *)&(((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                       super_QuantityS<polyscope::VolumeMesh>.parent)->
                     super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.field_0x3c0,
                 name);
  if ((iVar2._M_node !=
       (_Base_ptr)
       &(((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
          super_QuantityS<polyscope::VolumeMesh>.parent)->
        super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.field_0x3c8) &&
     (*(long *)(iVar2._M_node + 2) != 0)) {
    this_02 = (VolumeMeshVertexScalarQuantity *)
              __dynamic_cast(*(long *)(iVar2._M_node + 2),&VolumeMeshQuantity::typeinfo,&typeinfo,0)
    ;
    pEVar1 = render::engine;
    if (this_02 != (VolumeMeshVertexScalarQuantity *)0x0) {
      std::__cxx11::string::string((string *)&local_100,"SLICE_TETS",&local_101);
      this_01 = render::engine;
      VolumeMesh::getMaterial_abi_cxx11_
                (&local_50,
                 (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                 super_QuantityS<polyscope::VolumeMesh>.parent);
      this_00 = (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                super_QuantityS<polyscope::VolumeMesh>.parent;
      std::__cxx11::string::string((string *)&local_70,"SLICE_TETS_PROPAGATE_VALUE",&local_102);
      __l._M_len = 1;
      __l._M_array = &local_70;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_d0,__l,&local_103);
      ScalarQuantity<polyscope::VolumeMeshScalarQuantity>::addScalarRules
                (&local_b8,
                 &(this->super_VolumeMeshScalarQuantity).
                  super_ScalarQuantity<polyscope::VolumeMeshScalarQuantity>,&local_d0);
      VolumeMesh::addVolumeMeshRules(&local_a0,this_00,&local_b8,true,true);
      render::Engine::addMaterialRules(&local_88,this_01,&local_50,&local_a0);
      (*pEVar1->_vptr_Engine[0x2b])(&local_e0,pEVar1,&local_100,&local_88,0);
      std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->levelSetProgram).
                  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
                 &local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_100);
      VolumeMesh::fillSliceGeometryBuffers
                ((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                 super_QuantityS<polyscope::VolumeMesh>.parent,
                 (this->levelSetProgram).
                 super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      fillSliceColorBuffers
                (this_02,(this->levelSetProgram).
                         super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      pEVar1 = render::engine;
      program = (this->levelSetProgram).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      VolumeMesh::getMaterial_abi_cxx11_
                (&local_100,
                 (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                 super_QuantityS<polyscope::VolumeMesh>.parent);
      render::Engine::setMaterial(pEVar1,program,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      fillLevelSetData(this,(this->levelSetProgram).
                            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
      setLevelSetUniforms(this,(this->levelSetProgram).
                               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      this->showQuantity = this_02;
    }
  }
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setLevelSetVisibleQuantity(std::string name) {
  auto pair = parent.quantities.find(name);
  if (pair == parent.quantities.end()) {
    return;
  }
  VolumeMeshQuantity* vmq = pair->second.get();
  VolumeMeshVertexScalarQuantity* q = dynamic_cast<VolumeMeshVertexScalarQuantity*>(vmq);
  if (q == nullptr) {
    return;
  }

  // clang-format off
  levelSetProgram = render::engine->requestShader("SLICE_TETS", 
      render::engine->addMaterialRules(parent.getMaterial(),
        parent.addVolumeMeshRules(
          addScalarRules(
            {"SLICE_TETS_PROPAGATE_VALUE"}), 
        true, true)
      )
    );
  // clang-format on

  // Fill color buffers
  parent.fillSliceGeometryBuffers(*levelSetProgram);
  q->fillSliceColorBuffers(*levelSetProgram);
  render::engine->setMaterial(*levelSetProgram, parent.getMaterial());
  fillLevelSetData(*levelSetProgram);
  setLevelSetUniforms(*levelSetProgram);
  showQuantity = q;
}